

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,SpectrumHandle *r_bar,SpectrumHandle *g_bar,SpectrumHandle *b_bar,
          RGBColorSpace *outputColorSpace,Float wbTemp,Float imagingRatio,Allocator alloc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  SquareMatrix<3> *pSVar4;
  optional<pbrt::SquareMatrix<3>_> m;
  DenselySampledSpectrum sensorIlluminant;
  SpectrumHandle local_a8;
  SpectrumHandle local_a0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_98;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_90;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_88;
  optional<pbrt::SquareMatrix<3>_> local_80;
  DenselySampledSpectrum local_58;
  
  SquareMatrix<3>::SquareMatrix(&this->XYZFromSensorRGB);
  local_88.bits =
       (r_bar->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->r_bar,(SpectrumHandle *)&local_88,alloc);
  local_90.bits =
       (g_bar->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->g_bar,(SpectrumHandle *)&local_90,alloc);
  local_98.bits =
       (b_bar->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->b_bar,(SpectrumHandle *)&local_98,alloc);
  this->imagingRatio = imagingRatio;
  Spectra::D(&local_58,wbTemp,alloc);
  local_a0.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&local_58 | 0x2000000000000);
  local_a8.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&outputColorSpace->illuminant | 0x2000000000000);
  SolveXYZFromSensorRGB(&local_80,this,&local_a0,&local_a8);
  if (local_80.set != false) {
    pSVar4 = pstd::optional<pbrt::SquareMatrix<3>_>::value(&local_80);
    (this->XYZFromSensorRGB).m[2][2] = pSVar4->m[2][2];
    uVar1 = *(undefined8 *)(pSVar4->m[0] + 2);
    uVar2 = *(undefined8 *)(pSVar4->m[1] + 1);
    uVar3 = *(undefined8 *)pSVar4->m[2];
    *(undefined8 *)(this->XYZFromSensorRGB).m[0] = *(undefined8 *)pSVar4->m[0];
    *(undefined8 *)((this->XYZFromSensorRGB).m[0] + 2) = uVar1;
    *(undefined8 *)((this->XYZFromSensorRGB).m[1] + 1) = uVar2;
    *(undefined8 *)(this->XYZFromSensorRGB).m[2] = uVar3;
    pstd::optional<pbrt::SquareMatrix<3>_>::~optional(&local_80);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_58.values);
    return;
  }
  ErrorExit<>("Sensor XYZ from RGB matrix could not be solved.");
}

Assistant:

PixelSensor(SpectrumHandle r_bar, SpectrumHandle g_bar, SpectrumHandle b_bar,
                const RGBColorSpace *outputColorSpace, Float wbTemp, Float imagingRatio,
                Allocator alloc)
        : r_bar(r_bar, alloc),
          g_bar(g_bar, alloc),
          b_bar(b_bar, alloc),
          imagingRatio(imagingRatio) {
        // Compute XYZ from camera RGB matrix
        DenselySampledSpectrum sensorIlluminant = Spectra::D(wbTemp, alloc);
        pstd::optional<SquareMatrix<3>> m =
            SolveXYZFromSensorRGB(&sensorIlluminant, &outputColorSpace->illuminant);
        if (!m)
            ErrorExit("Sensor XYZ from RGB matrix could not be solved.");
        XYZFromSensorRGB = *m;
    }